

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

bool __thiscall
QGenericItemModel::removeColumns(QGenericItemModel *this,int column,int count,QModelIndex *parent)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  Op unaff_retaddr;
  int *args;
  
  args = *(int **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84fb76);
  bVar1 = QGenericItemModelImplBase::call<bool,int,int,QModelIndex>
                    ((QGenericItemModelImplBase *)parent,unaff_retaddr,args,
                     (int *)CONCAT44(in_ESI,in_EDX),in_RDI);
  if (*(int **)(in_FS_OFFSET + 0x28) == args) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::removeColumns(int column, int count, const QModelIndex &parent)
{
    return impl->call<bool>(QGenericItemModelImplBase::RemoveColumns, column, count, parent);
}